

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builderutil_snap_functions.cc
# Opt level: O2

void __thiscall s2builderutil::S2CellIdSnapFunction::set_level(S2CellIdSnapFunction *this,int level)

{
  S1Angle snap_radius;
  S2LogMessage SStack_18;
  
  if (level < 0) {
    S2LogMessage::S2LogMessage
              (&SStack_18,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builderutil_snap_functions.cc"
               ,0x58,kFatal,(ostream *)&std::cerr);
    std::operator<<(SStack_18.stream_,"Check failed: (level) >= (0) ");
  }
  else {
    if ((uint)level < 0x1f) {
      this->level_ = level;
      snap_radius = MinSnapRadiusForLevel(level);
      set_snap_radius(this,snap_radius);
      return;
    }
    S2LogMessage::S2LogMessage
              (&SStack_18,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builderutil_snap_functions.cc"
               ,0x59,kFatal,(ostream *)&std::cerr);
    std::operator<<(SStack_18.stream_,"Check failed: (level) <= (S2CellId::kMaxLevel) ");
  }
  abort();
}

Assistant:

void S2CellIdSnapFunction::set_level(int level) {
  S2_DCHECK_GE(level, 0);
  S2_DCHECK_LE(level, S2CellId::kMaxLevel);
  level_ = level;
  set_snap_radius(MinSnapRadiusForLevel(level));
}